

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O3

uoffset_t __thiscall
flatbuffers::FlatBufferBuilder::EndTable
          (FlatBufferBuilder *this,uoffset_t start,voffset_t numfields)

{
  ushort uVar1;
  size_t sVar2;
  pointer pFVar3;
  pointer pFVar4;
  iterator __position;
  FlatBufferBuilder *pFVar5;
  int iVar6;
  uint8_t *puVar7;
  short *psVar8;
  undefined6 in_register_00000012;
  pointer pFVar9;
  unsigned_short litle_endian_element;
  uint uVar10;
  uoffset_t uVar11;
  uint8_t *puVar12;
  size_t sVar13;
  ulong len;
  uint8_t *puVar14;
  uint *puVar15;
  ushort *__s2;
  uoffset_t vt_use;
  uint local_5c;
  FlatBufferBuilder *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  size_t local_38;
  
  Align(this,4);
  puVar7 = vector_downward::make_space(&this->buf_,4);
  puVar7[0] = '\0';
  puVar7[1] = '\0';
  puVar7[2] = '\0';
  puVar7[3] = '\0';
  puVar14 = (this->buf_).buf_ + ((this->buf_).reserved_ - (long)(this->buf_).cur_);
  iVar6 = (int)CONCAT62(in_register_00000012,numfields);
  len = (ulong)(uint)(iVar6 * 2);
  puVar7 = vector_downward::make_space(&this->buf_,len);
  if (iVar6 != 0) {
    memset(puVar7,0,len);
  }
  uVar10 = (int)puVar14 - start;
  if (0xffff < uVar10) {
    __assert_fail("table_object_size < 0x10000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                  ,0x199,"uoffset_t flatbuffers::FlatBufferBuilder::EndTable(uoffset_t, voffset_t)")
    ;
  }
  Align(this,2);
  puVar7 = vector_downward::make_space(&this->buf_,2);
  *(short *)puVar7 = (short)uVar10;
  Align(this,2);
  psVar8 = (short *)vector_downward::make_space(&this->buf_,2);
  *psVar8 = numfields * 2 + 4;
  sVar2 = (this->buf_).reserved_;
  puVar7 = (this->buf_).buf_;
  __s2 = (ushort *)(this->buf_).cur_;
  pFVar3 = (this->offsetbuf_).
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar4 = (this->offsetbuf_).
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar9 = pFVar3;
  if (pFVar3 != pFVar4) {
    do {
      if (*(short *)((long)__s2 + (ulong)pFVar9->id) != 0) {
        __assert_fail("!ReadScalar<voffset_t>(buf_.data() + field_location->id)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/flatbuffers.h"
                      ,0x1a2,
                      "uoffset_t flatbuffers::FlatBufferBuilder::EndTable(uoffset_t, voffset_t)");
      }
      *(short *)((long)__s2 + (ulong)pFVar9->id) = (short)puVar14 - (short)pFVar9->off;
      pFVar9 = pFVar9 + 1;
    } while (pFVar9 != pFVar4);
    if (pFVar3 != pFVar4) {
      (this->offsetbuf_).
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar3;
    }
  }
  uVar1 = *__s2;
  local_5c = (uint)(puVar7 + (sVar2 - (long)__s2));
  puVar15 = (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_50 = puVar14;
  sVar13 = sVar2;
  puVar14 = puVar7;
  puVar12 = puVar7 + (sVar2 - (long)__s2);
  local_58 = this;
  do {
    if (puVar15 == __position._M_current) {
LAB_0010ec35:
      puVar7 = local_50;
      pFVar5 = local_58;
      uVar10 = (uint)puVar12;
      if (uVar10 == ((int)sVar13 + (int)puVar14) - (int)__s2) {
        if (__position._M_current ==
            (local_58->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_58->vtables_,
                     __position,&local_5c);
          sVar13 = (pFVar5->buf_).reserved_;
          puVar14 = (pFVar5->buf_).buf_;
          uVar10 = local_5c;
        }
        else {
          *__position._M_current = uVar10;
          (local_58->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar11 = (uoffset_t)puVar7;
      *(uint *)(puVar14 + (sVar13 - ((ulong)puVar7 & 0xffffffff))) = uVar10 - uVar11;
      return uVar11;
    }
    uVar10 = *puVar15;
    local_48 = puVar12;
    local_40 = puVar14;
    local_38 = sVar13;
    iVar6 = bcmp(puVar7 + (sVar2 - (long)(ulong)uVar10),__s2,(ulong)uVar1);
    sVar13 = local_38;
    puVar14 = local_40;
    if (iVar6 == 0) {
      __s2 = (ushort *)((long)__s2 + (ulong)(uint)((int)local_48 - (int)local_50));
      (local_58->buf_).cur_ = (uint8_t *)__s2;
      puVar12 = (uint8_t *)(ulong)uVar10;
      local_5c = uVar10;
      goto LAB_0010ec35;
    }
    puVar15 = puVar15 + 1;
    puVar12 = local_48;
  } while( true );
}

Assistant:

uoffset_t EndTable(uoffset_t start, voffset_t numfields) {
    // Write the vtable offset, which is the start of any Table.
    // We fill it's value later.
    auto vtableoffsetloc = PushElement<uoffset_t>(0);
    // Write a vtable, which consists entirely of voffset_t elements.
    // It starts with the number of offsets, followed by a type id, followed
    // by the offsets themselves. In reverse:
    buf_.fill(numfields * sizeof(voffset_t));
    auto table_object_size = vtableoffsetloc - start;
    assert(table_object_size < 0x10000);  // Vtable use 16bit offsets.
    PushElement<voffset_t>(table_object_size);
    PushElement<voffset_t>(FieldIndexToOffset(numfields));
    // Write the offsets into the table
    for (auto field_location = offsetbuf_.begin();
              field_location != offsetbuf_.end();
            ++field_location) {
      auto pos = (vtableoffsetloc - field_location->off);
      // If this asserts, it means you've set a field twice.
      assert(!ReadScalar<voffset_t>(buf_.data() + field_location->id));
      WriteScalar<voffset_t>(buf_.data() + field_location->id, pos);
    }
    offsetbuf_.clear();
    auto vt1 = reinterpret_cast<voffset_t *>(buf_.data());
    auto vt1_size = *vt1;
    auto vt_use = GetSize();
    // See if we already have generated a vtable with this exact same
    // layout before. If so, make it point to the old one, remove this one.
    for (auto it = vtables_.begin(); it != vtables_.end(); ++it) {
      if (memcmp(buf_.data_at(*it), vt1, vt1_size)) continue;
      vt_use = *it;
      buf_.pop(GetSize() - vtableoffsetloc);
      break;
    }
    // If this is a new vtable, remember it.
    if (vt_use == GetSize()) {
      vtables_.push_back(vt_use);
    }
    // Fill the vtable offset we created above.
    // The offset points from the beginning of the object to where the
    // vtable is stored.
    // Offsets default direction is downward in memory for future format
    // flexibility (storing all vtables at the start of the file).
    WriteScalar(buf_.data_at(vtableoffsetloc),
                static_cast<soffset_t>(vt_use) -
                  static_cast<soffset_t>(vtableoffsetloc));
    return vtableoffsetloc;
  }